

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::
int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_>::on_hex
          (int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_> *this)

{
  undefined1 uVar1;
  uint uVar2;
  long in_RDI;
  int in_stack_0000000c;
  basic_writer<fmt::v6::buffer_range<char>_> *in_stack_00000010;
  undefined1 in_stack_00000018 [16];
  undefined1 in_stack_00000028 [16];
  hex_writer in_stack_00000040;
  int num_digits;
  
  if (*(char *)(*(long *)(in_RDI + 8) + 9) < '\0') {
    uVar2 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x14 + (ulong)uVar2) = 0x30;
    uVar1 = *(undefined1 *)(*(long *)(in_RDI + 8) + 8);
    uVar2 = *(uint *)(in_RDI + 0x18);
    *(uint *)(in_RDI + 0x18) = uVar2 + 1;
    *(undefined1 *)(in_RDI + 0x14 + (ulong)uVar2) = uVar1;
  }
  count_digits<4u,unsigned_int>(*(uint *)(in_RDI + 0x10));
  get_prefix((int_writer<unsigned_int,_fmt::v6::basic_format_specs<char>_> *)0x142edb);
  basic_writer<fmt::v6::buffer_range<char>>::
  write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<unsigned_int,fmt::v6::basic_format_specs<char>>::hex_writer>
            (in_stack_00000010,in_stack_0000000c,(string_view)in_stack_00000028,
             (format_specs)in_stack_00000018,in_stack_00000040);
  return;
}

Assistant:

void on_hex() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = specs.type;
      }
      int num_digits = count_digits<4>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       hex_writer{*this, num_digits});
    }